

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLenum gl4cts::EnhancedLayouts::Utils::Texture::GetTargetGLenum(TYPES type)

{
  GLenum local_10;
  GLenum result;
  TYPES type_local;
  
  local_10 = 0;
  switch(type) {
  case TEX_BUFFER:
    local_10 = 0x8c2a;
    break;
  case TEX_2D:
    local_10 = 0xde1;
    break;
  case TEX_2D_RECT:
    local_10 = 0x84f5;
    break;
  case TEX_2D_ARRAY:
    local_10 = 0x8c1a;
    break;
  case TEX_3D:
    local_10 = 0x806f;
    break;
  case TEX_CUBE:
    local_10 = 0x8513;
    break;
  case TEX_1D:
    local_10 = 0xde0;
    break;
  case TEX_1D_ARRAY:
    local_10 = 0x8c18;
  }
  return local_10;
}

Assistant:

GLenum Texture::GetTargetGLenum(TYPES type)
{
	GLenum result = 0;

	switch (type)
	{
	case TEX_BUFFER:
		result = GL_TEXTURE_BUFFER;
		break;
	case TEX_2D:
		result = GL_TEXTURE_2D;
		break;
	case TEX_2D_RECT:
		result = GL_TEXTURE_RECTANGLE;
		break;
	case TEX_2D_ARRAY:
		result = GL_TEXTURE_2D_ARRAY;
		break;
	case TEX_3D:
		result = GL_TEXTURE_3D;
		break;
	case TEX_CUBE:
		result = GL_TEXTURE_CUBE_MAP;
		break;
	case TEX_1D:
		result = GL_TEXTURE_1D;
		break;
	case TEX_1D_ARRAY:
		result = GL_TEXTURE_1D_ARRAY;
		break;
	}

	return result;
}